

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigFlagsTable.cpp
# Opt level: O3

void __thiscall Js::String::Set(String *this,char16 *pszValue)

{
  long lVar1;
  char16 cVar2;
  size_t sVar3;
  size_t sVar4;
  char16 *pcVar5;
  ulong uVar6;
  size_t __n;
  ulong uVar7;
  
  if (this->pszValue != (char16_t *)0x0) {
    sVar3 = PAL_wcslen(this->pszValue);
    Memory::DeleteArray<Memory::NoCheckHeapAllocator,char16_t>
              ((AllocatorType *)&Memory::NoCheckHeapAllocator::Instance,sVar3 + 1,this->pszValue);
  }
  if (pszValue == (char16 *)0x0) {
    this->pszValue = (char16 *)0x0;
    return;
  }
  sVar4 = PAL_wcslen(pszValue);
  uVar7 = sVar4 + 1;
  sVar3 = 0xffffffffffffffff;
  if (-1 < (long)uVar7) {
    sVar3 = uVar7 * 2;
  }
  pcVar5 = (char16 *)
           Memory::NoCheckHeapAllocator::Alloc
                     ((NoCheckHeapAllocator *)&Memory::NoCheckHeapAllocator::Instance,sVar3);
  this->pszValue = pcVar5;
  if (pcVar5 != (char16 *)0x0 && uVar7 != 0) {
    __n = sVar4 * 2;
    uVar6 = 1;
    do {
      cVar2 = pszValue[uVar6 - 1];
      pcVar5[uVar6 - 1] = cVar2;
      if (cVar2 == L'\0') {
        if (uVar7 <= uVar6) {
          return;
        }
        memset(pcVar5 + uVar6,0xfd,__n);
        return;
      }
      __n = __n - 2;
      lVar1 = uVar6 - sVar4;
      uVar6 = uVar6 + 1;
    } while (lVar1 != 1);
    *pcVar5 = L'\0';
    if (1 < uVar7) {
      memset(pcVar5 + 1,0xfd,uVar7 * 2 - 2);
    }
  }
  RaiseException(0xc000000d,0,0,(ULONG_PTR *)0x0);
  return;
}

Assistant:

void
    String::Set(__in_z_opt const char16* pszValue)
    {
        if(NULL != this->pszValue)
        {
            NoCheckHeapDeleteArray(wcslen(this->pszValue) + 1, this->pszValue);
        }

        if(NULL != pszValue)
        {
            size_t size    = 1 + wcslen(pszValue);
            this->pszValue  = NoCheckHeapNewArray(char16, size);
            wcscpy_s(this->pszValue, size, pszValue);
        }
        else
        {
            this->pszValue = NULL;
        }
    }